

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O1

void CECoordinates::Galactic2CIRS
               (double glon,double glat,double *ra,double *dec,CEDate *date,CEAngleType *angle_type)

{
  CEAngleType local_30 [2];
  
  if (*angle_type == DEGREES) {
    glon = glon * 0.017453292519943295;
    glat = glat * 0.017453292519943295;
  }
  local_30[1] = 1;
  Galactic2ICRS(glon,glat,ra,dec,local_30 + 1);
  local_30[0] = RADIANS;
  ICRS2CIRS(*ra,*dec,ra,dec,date,local_30);
  if (*angle_type == DEGREES) {
    *ra = *ra * 57.29577951308232;
    *dec = *dec * 57.29577951308232;
  }
  return;
}

Assistant:

void CECoordinates::Galactic2CIRS(double glon, double glat, double *ra, double *dec,
                                  const CEDate& date, const CEAngleType& angle_type)
{
    // Check for degrees
    if (angle_type == CEAngleType::DEGREES) {
        glon *= DD2R ;
        glat *= DD2R ;
    }
    
    // Do the Galactic -> ICRS converstion
    Galactic2ICRS(glon, glat, ra, dec, CEAngleType::RADIANS) ;
    
    // Now convert ICRS -> CIRS
    double tmp_ra(*ra);
    double tmp_dec(*dec);
    ICRS2CIRS(tmp_ra, tmp_dec, ra, dec, date, CEAngleType::RADIANS) ;
    
    // Now make sure to return the coordinates in the correct format
    if (angle_type == CEAngleType::DEGREES) {
        *ra  *= DR2D ;
        *dec *= DR2D ;
    }
}